

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

int anon_unknown.dwarf_211787::verify_state(snd_pcm_t *handle)

{
  int iVar1;
  int iVar2;
  undefined8 in_RDI;
  int err;
  snd_pcm_state_t state;
  
  iVar1 = (*(anonymous_namespace)::psnd_pcm_state)(in_RDI);
  switch(iVar1) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 5:
  case 6:
    return iVar1;
  case 4:
    iVar2 = (*(anonymous_namespace)::psnd_pcm_recover)(in_RDI,0xffffffe0,1);
    break;
  case 7:
    iVar2 = (*(anonymous_namespace)::psnd_pcm_recover)(in_RDI,0xffffffaa,1);
    break;
  case 8:
    return -0x13;
  default:
    goto switchD_00232bcd_default;
  }
  if (iVar2 < 0) {
    return iVar2;
  }
switchD_00232bcd_default:
  return iVar1;
}

Assistant:

int verify_state(snd_pcm_t *handle)
{
    snd_pcm_state_t state{snd_pcm_state(handle)};

    int err;
    switch(state)
    {
        case SND_PCM_STATE_OPEN:
        case SND_PCM_STATE_SETUP:
        case SND_PCM_STATE_PREPARED:
        case SND_PCM_STATE_RUNNING:
        case SND_PCM_STATE_DRAINING:
        case SND_PCM_STATE_PAUSED:
            /* All Okay */
            break;

        case SND_PCM_STATE_XRUN:
            if((err=snd_pcm_recover(handle, -EPIPE, 1)) < 0)
                return err;
            break;
        case SND_PCM_STATE_SUSPENDED:
            if((err=snd_pcm_recover(handle, -ESTRPIPE, 1)) < 0)
                return err;
            break;
        case SND_PCM_STATE_DISCONNECTED:
            return -ENODEV;
    }

    return state;
}